

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comment.cc
# Opt level: O3

void __thiscall CommentDatabaseInternal::clear(CommentDatabaseInternal *this)

{
  void *pvVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->commentset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->commentset)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    pvVar1 = *(void **)(p_Var2 + 1);
    if ((pvVar1 != (void *)0x0) &&
       (*(void **)((long)pvVar1 + 0x30) != (void *)((long)pvVar1 + 0x40))) {
      operator_delete(*(void **)((long)pvVar1 + 0x30));
    }
    operator_delete(pvVar1);
  }
  std::
  _Rb_tree<Comment_*,_Comment_*,_std::_Identity<Comment_*>,_CommentOrder,_std::allocator<Comment_*>_>
  ::clear(&(this->commentset)._M_t);
  return;
}

Assistant:

void CommentDatabaseInternal::clear(void)

{
  CommentSet::iterator iter;

  for(iter=commentset.begin();iter!=commentset.end();++iter)
    delete *iter;
  commentset.clear();
}